

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O0

int next_cache_entry(archive_read *a,iso9660 *iso9660,file_info **pfile)

{
  int iVar1;
  file_info *pfVar2;
  file_info *pfVar3;
  bool bVar4;
  int r;
  int nexted_re;
  file_info *first_re;
  file_info *d;
  file_info *re;
  int count;
  int64_t number;
  anon_struct_16_2_ec647c9d empty_files;
  file_info *file;
  file_info **pfile_local;
  iso9660 *iso9660_local;
  archive_read *a_local;
  
  pfVar2 = cache_get_entry(iso9660);
  if (pfVar2 != (file_info *)0x0) {
    *pfile = pfVar2;
    return 0;
  }
  empty_files.last = (file_info **)0x0;
LAB_0029a7c1:
  do {
    while( true ) {
      empty_files.last = &heap_get_entry(&iso9660->pending_files)->use_next;
      *pfile = (file_info *)empty_files.last;
      if ((file_info *)empty_files.last == (file_info *)0x0) {
        if ((((iso9660->re_files).first != (file_info *)0x0) &&
            (iso9660->rr_moved != (file_info *)0x0)) &&
           (iso9660->rr_moved->rr_moved_has_re_only != '\0')) {
          cache_add_entry(iso9660,iso9660->rr_moved);
        }
        while (pfVar2 = re_get_entry(iso9660), pfVar2 != (file_info *)0x0) {
          while (pfVar3 = rede_get_entry(pfVar2), pfVar3 != (file_info *)0x0) {
            cache_add_entry(iso9660,pfVar3);
          }
        }
        if ((iso9660->cache_files).first != (file_info *)0x0) {
          iVar1 = next_cache_entry(a,iso9660,pfile);
          return iVar1;
        }
        return 1;
      }
      if (((file_info *)empty_files.last)->cl_offset == 0) break;
      _r = (file_info *)0x0;
      bVar4 = false;
      while( true ) {
        pfVar2 = re_get_entry(iso9660);
        if (pfVar2 == _r) goto LAB_0029a9b4;
        if (_r == (file_info *)0x0) {
          _r = pfVar2;
        }
        if ((file_info *)pfVar2->offset == empty_files.last[10]) break;
        re_add_entry(iso9660,pfVar2);
      }
      pfVar2->parent->subdirs = pfVar2->parent->subdirs + -1;
      pfVar2->parent = empty_files.last[1];
      pfVar2->re = '\0';
      if (pfVar2->parent->re_descendant == '\0') {
        *pfile = pfVar2;
        empty_files.last = &pfVar2->use_next;
        while (pfVar2 = rede_get_entry((file_info *)empty_files.last), pfVar2 != (file_info *)0x0) {
          cache_add_entry(iso9660,pfVar2);
        }
      }
      else {
        bVar4 = true;
        pfVar2->re_descendant = '\x01';
        iVar1 = rede_add_entry(pfVar2);
        while( true ) {
          if (iVar1 < 0) {
            archive_set_error(&a->archive,-1,
                              "Failed to connect \'CL\' pointer to \'RE\' rr_moved pointer of Rockridge extensions: current position = %jd, CL offset = %jd"
                              ,iso9660->current_position,empty_files.last[10]);
            return -0x1e;
          }
          pfVar3 = rede_get_entry(pfVar2);
          if (pfVar3 == (file_info *)0x0) break;
          iVar1 = rede_add_entry(pfVar3);
        }
      }
LAB_0029a9b4:
      if (!bVar4) goto LAB_0029aa59;
    }
    if ((((file_info *)empty_files.last)->mode & 0xf000) != 0x4000) goto LAB_0029aa59;
    iVar1 = read_children(a,(file_info *)empty_files.last);
    if (iVar1 != 0) {
      return iVar1;
    }
    if (*(char *)(empty_files.last + 9) == '\0') {
      if (*(char *)((long)empty_files.last + 0x4a) == '\0') {
        if ((*(char *)((long)empty_files.last + 0x4b) == '\0') ||
           (iVar1 = rede_add_entry((file_info *)empty_files.last), iVar1 != 0)) goto LAB_0029aa59;
      }
      else {
        re_add_entry(iso9660,(file_info *)empty_files.last);
      }
      goto LAB_0029a7c1;
    }
    if (*(char *)((long)empty_files.last + 0x49) == '\0') {
LAB_0029aa59:
      if ((((ulong)empty_files.last[0x11] & 0xf000) != 0x8000) ||
         (empty_files.last[0x13] == (file_info *)0xffffffffffffffff)) {
        return 0;
      }
      re._4_4_ = 0;
      pfVar2 = empty_files.last[0x13];
      (iso9660->cache_files).first = (file_info *)0x0;
      (iso9660->cache_files).last = &(iso9660->cache_files).first;
      number = 0;
      empty_files.first = (file_info *)&number;
      while( true ) {
        bVar4 = false;
        if ((0 < (iso9660->pending_files).used) &&
           (bVar4 = true, (*(iso9660->pending_files).files)->number != -1)) {
          bVar4 = (file_info *)(*(iso9660->pending_files).files)->number == pfVar2;
        }
        if (!bVar4) break;
        if (empty_files.last[0x13] == (file_info *)0xffffffffffffffff) {
          empty_files.last[2] = (file_info *)0x0;
          (empty_files.first)->use_next = (file_info *)empty_files.last;
          empty_files.first = (file_info *)(empty_files.last + 2);
        }
        else {
          re._4_4_ = re._4_4_ + 1;
          cache_add_entry(iso9660,(file_info *)empty_files.last);
        }
        empty_files.last = &heap_get_entry(&iso9660->pending_files)->use_next;
      }
      if (re._4_4_ == 0) {
        *pfile = (file_info *)empty_files.last;
        return (uint)(empty_files.last == (file_info **)0x0);
      }
      if (empty_files.last[0x13] == (file_info *)0xffffffffffffffff) {
        empty_files.last[2] = (file_info *)0x0;
        (empty_files.first)->use_next = (file_info *)empty_files.last;
        empty_files.first = (file_info *)(empty_files.last + 2);
      }
      else {
        re._4_4_ = re._4_4_ + 1;
        cache_add_entry(iso9660,(file_info *)empty_files.last);
      }
      if (1 < re._4_4_) {
        for (empty_files.last = &((iso9660->cache_files).first)->use_next;
            empty_files.last != (file_info **)0x0; empty_files.last = &empty_files.last[2]->use_next
            ) {
          *(int *)(empty_files.last + 0x14) = re._4_4_;
        }
      }
      if (number != 0) {
        *(iso9660->cache_files).last = (file_info *)number;
        (iso9660->cache_files).last = &(empty_files.first)->use_next;
      }
      pfVar2 = cache_get_entry(iso9660);
      *pfile = pfVar2;
      return (uint)(*pfile == (file_info *)0x0);
    }
  } while( true );
}

Assistant:

static int
next_cache_entry(struct archive_read *a, struct iso9660 *iso9660,
    struct file_info **pfile)
{
	struct file_info *file;
	struct {
		struct file_info	*first;
		struct file_info	**last;
	}	empty_files;
	int64_t number;
	int count;

	file = cache_get_entry(iso9660);
	if (file != NULL) {
		*pfile = file;
		return (ARCHIVE_OK);
	}

	for (;;) {
		struct file_info *re, *d;

		*pfile = file = next_entry(iso9660);
		if (file == NULL) {
			/*
			 * If directory entries all which are descendant of
			 * rr_moved are still remaining, expose their.
			 */
			if (iso9660->re_files.first != NULL &&
			    iso9660->rr_moved != NULL &&
			    iso9660->rr_moved->rr_moved_has_re_only)
				/* Expose "rr_moved" entry. */
				cache_add_entry(iso9660, iso9660->rr_moved);
			while ((re = re_get_entry(iso9660)) != NULL) {
				/* Expose its descendant dirs. */
				while ((d = rede_get_entry(re)) != NULL)
					cache_add_entry(iso9660, d);
			}
			if (iso9660->cache_files.first != NULL)
				return (next_cache_entry(a, iso9660, pfile));
			return (ARCHIVE_EOF);
		}

		if (file->cl_offset) {
			struct file_info *first_re = NULL;
			int nexted_re = 0;

			/*
			 * Find "RE" dir for the current file, which
			 * has "CL" flag.
			 */
			while ((re = re_get_entry(iso9660))
			    != first_re) {
				if (first_re == NULL)
					first_re = re;
				if (re->offset == file->cl_offset) {
					re->parent->subdirs--;
					re->parent = file->parent;
					re->re = 0;
					if (re->parent->re_descendant) {
						nexted_re = 1;
						re->re_descendant = 1;
						if (rede_add_entry(re) < 0)
							goto fatal_rr;
						/* Move a list of descendants
						 * to a new ancestor. */
						while ((d = rede_get_entry(
						    re)) != NULL)
							if (rede_add_entry(d)
							    < 0)
								goto fatal_rr;
						break;
					}
					/* Replace the current file
					 * with "RE" dir */
					*pfile = file = re;
					/* Expose its descendant */
					while ((d = rede_get_entry(
					    file)) != NULL)
						cache_add_entry(
						    iso9660, d);
					break;
				} else
					re_add_entry(iso9660, re);
			}
			if (nexted_re) {
				/*
				 * Do not expose this at this time
				 * because we have not gotten its full-path
				 * name yet.
				 */
				continue;
			}
		} else if ((file->mode & AE_IFMT) == AE_IFDIR) {
			int r;

			/* Read file entries in this dir. */
			r = read_children(a, file);
			if (r != ARCHIVE_OK)
				return (r);

			/*
			 * Handle a special dir of Rockridge extensions,
			 * "rr_moved".
			 */
			if (file->rr_moved) {
				/*
				 * If this has only the subdirectories which
				 * have "RE" flags, do not expose at this time.
				 */
				if (file->rr_moved_has_re_only)
					continue;
				/* Otherwise expose "rr_moved" entry. */
			} else if (file->re) {
				/*
				 * Do not expose this at this time
				 * because we have not gotten its full-path
				 * name yet.
				 */
				re_add_entry(iso9660, file);
				continue;
			} else if (file->re_descendant) {
				/*
				 * If the top level "RE" entry of this entry
				 * is not exposed, we, accordingly, should not
				 * expose this entry at this time because
				 * we cannot make its proper full-path name.
				 */
				if (rede_add_entry(file) == 0)
					continue;
				/* Otherwise we can expose this entry because
				 * it seems its top level "RE" has already been
				 * exposed. */
			}
		}
		break;
	}

	if ((file->mode & AE_IFMT) != AE_IFREG || file->number == -1)
		return (ARCHIVE_OK);

	count = 0;
	number = file->number;
	iso9660->cache_files.first = NULL;
	iso9660->cache_files.last = &(iso9660->cache_files.first);
	empty_files.first = NULL;
	empty_files.last = &empty_files.first;
	/* Collect files which has the same file serial number.
	 * Peek pending_files so that file which number is different
	 * is not put back. */
	while (iso9660->pending_files.used > 0 &&
	    (iso9660->pending_files.files[0]->number == -1 ||
	     iso9660->pending_files.files[0]->number == number)) {
		if (file->number == -1) {
			/* This file has the same offset
			 * but it's wrong offset which empty files
			 * and symlink files have.
			 * NOTE: This wrong offset was recorded by
			 * old mkisofs utility. If ISO images is
			 * created by latest mkisofs, this does not
			 * happen.
			 */
			file->next = NULL;
			*empty_files.last = file;
			empty_files.last = &(file->next);
		} else {
			count++;
			cache_add_entry(iso9660, file);
		}
		file = next_entry(iso9660);
	}

	if (count == 0) {
		*pfile = file;
		return ((file == NULL)?ARCHIVE_EOF:ARCHIVE_OK);
	}
	if (file->number == -1) {
		file->next = NULL;
		*empty_files.last = file;
		empty_files.last = &(file->next);
	} else {
		count++;
		cache_add_entry(iso9660, file);
	}

	if (count > 1) {
		/* The count is the same as number of hardlink,
		 * so much so that each nlinks of files in cache_file
		 * is overwritten by value of the count.
		 */
		for (file = iso9660->cache_files.first;
		    file != NULL; file = file->next)
			file->nlinks = count;
	}
	/* If there are empty files, that files are added
	 * to the tail of the cache_files. */
	if (empty_files.first != NULL) {
		*iso9660->cache_files.last = empty_files.first;
		iso9660->cache_files.last = empty_files.last;
	}
	*pfile = cache_get_entry(iso9660);
	return ((*pfile == NULL)?ARCHIVE_EOF:ARCHIVE_OK);

fatal_rr:
	archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
	    "Failed to connect 'CL' pointer to 'RE' rr_moved pointer of "
	    "Rockridge extensions: current position = %jd, CL offset = %jd",
	    (intmax_t)iso9660->current_position, (intmax_t)file->cl_offset);
	return (ARCHIVE_FATAL);
}